

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalLibraryBase.cpp
# Opt level: O0

void __thiscall
Js::ExternalLibraryBase::Initialize(ExternalLibraryBase *this,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  ExternalLibraryBase **ppEVar5;
  ExternalLibraryBase *local_20;
  ExternalLibraryBase *current;
  JavascriptLibrary *library_local;
  ExternalLibraryBase *this_local;
  
  if (this->javascriptLibrary != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                ,0x13,"(this->javascriptLibrary == nullptr)",
                                "this->javascriptLibrary == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->javascriptLibrary = library;
  pSVar4 = JavascriptLibrary::GetScriptContext(library);
  this->scriptContext = pSVar4;
  ppEVar5 = Memory::WriteBarrierPtr::operator_cast_to_ExternalLibraryBase__
                      ((WriteBarrierPtr *)&library->externalLibraryList);
  local_20 = *ppEVar5;
  do {
    if (local_20 == (ExternalLibraryBase *)0x0) {
      ppEVar5 = Memory::WriteBarrierPtr::operator_cast_to_ExternalLibraryBase__
                          ((WriteBarrierPtr *)&library->externalLibraryList);
      this->next = *ppEVar5;
      Memory::WriteBarrierPtr<Js::ExternalLibraryBase>::operator=
                (&library->externalLibraryList,this);
      return;
    }
    if (local_20 == this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                  ,0x1a,"(current != this)","current != this");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

void ExternalLibraryBase::Initialize(JavascriptLibrary* library)
    {
        Assert(this->javascriptLibrary == nullptr);
        this->javascriptLibrary = library;
        this->scriptContext = library->GetScriptContext();
#if DBG
        ExternalLibraryBase* current = library->externalLibraryList;
        while (current != nullptr)
        {
            Assert(current != this);
            current = current->next;
        }
#endif
        this->next = library->externalLibraryList;
        library->externalLibraryList = this;
    }